

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderTessellation.cpp
# Opt level: O0

IterateResult __thiscall
glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::iterate
          (TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this)

{
  bool bVar1;
  int iVar2;
  deUint32 dVar3;
  NotSupportedError *this_00;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  MessageBuilder *pMVar6;
  TestError *pTVar7;
  GLuint local_874;
  MessageBuilder local_848;
  MessageBuilder local_6c8;
  uint local_548;
  uint local_544;
  int expected_patch_vertices_in_value;
  uint n_coordinate_2;
  MessageBuilder local_3c0;
  uint local_23c;
  uint local_238;
  int expected_primitive_id;
  uint actual_n_coordinate;
  uint n_coordinate_1;
  uint n_result_vertices_per_instance;
  uint n_result_vertices_per_patch_vertex_batch;
  uint local_a4;
  uint local_a0;
  int invocation_id_value;
  int expected_invocation_id;
  uint n_coordinate;
  int *result_traveller_ptr;
  uint *puStack_88;
  uint n_int_varyings_per_tess_coordinate;
  int *result_data;
  int local_78;
  GLenum tf_mode;
  GLint drawcall_count;
  GLint bo_size;
  _run *run;
  __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
  local_60;
  __normal_iterator<const_glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
  local_58;
  _runs_const_iterator run_iterator;
  Functions *gl;
  allocator<char> local_31;
  string local_30;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *local_10;
  TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID *this_local;
  
  local_10 = this;
  if (((this->super_TestCaseBase).m_is_tessellation_shader_supported & 1U) == 0) {
    this_00 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_30,"Tessellation shader functionality not supported, skipping",
               &local_31);
    tcu::NotSupportedError::NotSupportedError(this_00,&local_30);
    __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::NotSupportedError::~NotSupportedError
               );
  }
  initTest(this);
  pRVar4 = deqp::Context::getRenderContext((this->super_TestCaseBase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  run_iterator._M_current = (_run *)CONCAT44(extraout_var,iVar2);
  (**(code **)&run_iterator._M_current[0x1f].n_instances)(0x8c89);
  dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
  glu::checkError(dVar3,"glEnable(GL_RASTERIZER_DISCARD) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x531);
  (**(code **)&run_iterator._M_current[0x1f].n_instances)(0x8d69);
  dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
  glu::checkError(dVar3,"glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                  ,0x535);
  local_60._M_current =
       (_run *)std::
               vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
               ::begin(&this->m_runs);
  __gnu_cxx::
  __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_const*,std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>>>
  ::
  __normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run*>
            ((__normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_const*,std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>>>
              *)&local_58,&local_60);
  do {
    run = (_run *)std::
                  vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>
                  ::end(&this->m_runs);
    bVar1 = __gnu_cxx::operator!=
                      (&local_58,
                       (__normal_iterator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
                        *)&run);
    if (!bVar1) {
      tcu::TestContext::setTestResult
                ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx,
                 QP_TEST_RESULT_PASS,"Pass");
      return STOP;
    }
    _drawcall_count =
         __gnu_cxx::
         __normal_iterator<const_glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
         ::operator*(&local_58);
    (**(code **)&run_iterator._M_current[0x54].n_restart_indices)
              ((this->super_TestCaseBase).m_glExtTokens.PATCH_VERTICES,
               _drawcall_count->n_patch_vertices);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x53e);
    (**(code **)(run_iterator._M_current + 0x78))(_drawcall_count->po_id);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glUseProgram() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x542);
    if ((_drawcall_count->drawcall_is_indiced & 1U) == 0) {
      local_874 = 0;
    }
    else {
      local_874 = _drawcall_count->bo_indices_id;
    }
    (**(code **)&run_iterator._M_current[1].n_instances)(0x8893,local_874);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"Could not update GL_ELEMENT_ARRAY_BUFFER binding",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x546);
    (**(code **)&run_iterator._M_current[1].n_instances)(0x8c8e,this->m_bo_id);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glBindBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x54a);
    (**(code **)&run_iterator._M_current[1].n_restart_indices)(0x8c8e,0,this->m_bo_id);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glBindBufferBase() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x54d);
    tf_mode = _drawcall_count->n_result_vertices * 0x14;
    (**(code **)(run_iterator._M_current + 7))(0x8c8e,(long)(int)tf_mode,0,0x88e4);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glBufferData() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x554);
    local_78 = _drawcall_count->n_patch_vertices * _drawcall_count->drawcall_count_multiplier +
               _drawcall_count->n_restart_indices;
    result_data._4_4_ =
         TessellationShaderUtils::getTFModeForPrimitiveMode(_drawcall_count->primitive_mode,false);
    (**(code **)(run_iterator._M_current + 1))(result_data._4_4_);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glBeginTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x55c);
    if ((_drawcall_count->drawcall_is_indiced & 1U) == 0) {
      if (_drawcall_count->n_instances == 1) {
        (**(code **)&run_iterator._M_current[0x1b].tc_id)
                  ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,local_78);
        dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
        glu::checkError(dVar3,"glDrawArrays() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                        ,0x579);
      }
      else {
        (**(code **)&run_iterator._M_current[0x1c].drawcall_is_indiced)
                  ((this->super_TestCaseBase).m_glExtTokens.PATCHES,0,local_78,
                   _drawcall_count->n_instances);
        dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
        glu::checkError(dVar3,"glDrawArraysInstanced() failed",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                        ,0x573);
      }
    }
    else if (_drawcall_count->n_instances == 1) {
      (**(code **)&run_iterator._M_current[0x1c].tc_id)
                ((this->super_TestCaseBase).m_glExtTokens.PATCHES,local_78,0x1401,0);
      dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
      glu::checkError(dVar3,"glDrawElements() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x56a);
    }
    else {
      (**(code **)&run_iterator._M_current[0x1d].n_instances)
                ((this->super_TestCaseBase).m_glExtTokens.PATCHES,local_78,0x1401,0,
                 _drawcall_count->n_instances);
      dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
      glu::checkError(dVar3,"glDrawElementsInstanced() failed",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                      ,0x565);
    }
    (**(code **)&run_iterator._M_current[0x21].drawcall_is_indiced)();
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glEndTransformFeedback() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x57e);
    puStack_88 = (uint *)(**(code **)&run_iterator._M_current[0x45].n_instances)
                                   (0x8c8e,0,(long)(int)tf_mode,1);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glMapBufferRange() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x584);
    result_traveller_ptr._4_4_ = 5;
    _expected_invocation_id = puStack_88;
    for (invocation_id_value = 0; (uint)invocation_id_value < _drawcall_count->n_result_vertices;
        invocation_id_value = invocation_id_value + 1) {
      local_a0 = _drawcall_count->n_patch_vertices - 1;
      local_a4 = *_expected_invocation_id;
      if (local_a4 != local_a0) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&n_result_vertices_per_instance,pTVar5,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&n_result_vertices_per_instance,
                            (char (*) [32])"Invalid gl_InvocationID value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_a4);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [44])") was found for result coordinate at index ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&invocation_id_value);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [29])0x2b244c1);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_a0);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [3])0x2c23dab);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&n_result_vertices_per_instance);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid gl_InvocationID value used in TC stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5a0);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      _expected_invocation_id = _expected_invocation_id + 5;
    }
    n_coordinate_1 =
         (uint)(((ulong)_drawcall_count->n_result_vertices /
                (ulong)_drawcall_count->drawcall_count_multiplier) /
               (ulong)_drawcall_count->n_instances);
    actual_n_coordinate = _drawcall_count->n_result_vertices / _drawcall_count->n_instances;
    for (expected_primitive_id = 0; (uint)expected_primitive_id < _drawcall_count->n_result_vertices
        ; expected_primitive_id = expected_primitive_id + 1) {
      for (local_238 = expected_primitive_id; actual_n_coordinate <= local_238;
          local_238 = local_238 - actual_n_coordinate) {
      }
      local_23c = local_238 / n_coordinate_1;
      _expected_invocation_id = puStack_88 + (ulong)(uint)(expected_primitive_id * 5) + 2;
      if (*_expected_invocation_id != local_23c) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_3c0,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_3c0,(char (*) [31])"Invalid gl_PrimitiveID value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)_expected_invocation_id);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [51])
                                   ") was used in TC stage instead of expected value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_23c);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [45])")  as stored for result coordinate at index ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&expected_primitive_id);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_3c0);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid gl_PrimitiveID value used in TC stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5cb);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      _expected_invocation_id = puStack_88 + (ulong)(uint)(expected_primitive_id * 5) + 4;
      if (*_expected_invocation_id != local_23c) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<
                  ((MessageBuilder *)&expected_patch_vertices_in_value,pTVar5,
                   (BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           ((MessageBuilder *)&expected_patch_vertices_in_value,
                            (char (*) [31])"Invalid gl_PrimitiveID value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)_expected_invocation_id);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [51])
                                   ") was used in TE stage instead of expected value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_23c);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [45])")  as stored for result coordinate at index ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(uint *)&expected_primitive_id);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&expected_patch_vertices_in_value);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid gl_PrimitiveID value used in TE stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5db);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
    }
    for (local_544 = 0; local_544 < _drawcall_count->n_result_vertices; local_544 = local_544 + 1) {
      local_548 = _drawcall_count->n_patch_vertices;
      _expected_invocation_id = puStack_88 + (ulong)(local_544 * 5) + 1;
      if (*_expected_invocation_id != local_548) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_6c8,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_6c8,(char (*) [35])"Invalid gl_PatchVerticesIn value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)_expected_invocation_id);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [51])
                                   ") was used in TC stage instead of expected value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_548);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [45])")  as stored for result coordinate at index ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_544);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_6c8);
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        tcu::TestError::TestError
                  (pTVar7,"Invalid gl_PatchVerticesIn value used in TC stage",(char *)0x0,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                   ,0x5fa);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::TestError::~TestError);
      }
      _expected_invocation_id = puStack_88 + (ulong)(local_544 * 5) + 3;
      if (*_expected_invocation_id != local_548) {
        pTVar5 = tcu::TestContext::getLog
                           ((this->super_TestCaseBase).super_TestCase.super_TestNode.m_testCtx);
        tcu::TestLog::operator<<(&local_848,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (&local_848,(char (*) [35])"Invalid gl_PatchVerticesIn value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)_expected_invocation_id);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [51])
                                   ") was used in TE stage instead of expected value (");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(int *)&local_548);
        pMVar6 = tcu::MessageBuilder::operator<<
                           (pMVar6,(char (*) [45])")  as stored for result coordinate at index ");
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,&local_544);
        pMVar6 = tcu::MessageBuilder::operator<<(pMVar6,(char (*) [2])0x2b6cb9a);
        tcu::MessageBuilder::operator<<(pMVar6,(EndMessageToken *)&tcu::TestLog::EndMessage);
        tcu::MessageBuilder::~MessageBuilder(&local_848);
      }
    }
    (**(code **)&run_iterator._M_current[0x77].po_id)(0x8c8e);
    dVar3 = (**(code **)&run_iterator._M_current[0x2a].po_id)();
    glu::checkError(dVar3,"glUnmapBuffer() failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/glesext/tessellation_shader/esextcTessellationShaderTessellation.cpp"
                    ,0x60e);
    __gnu_cxx::
    __normal_iterator<const_glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run_*,_std::vector<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run,_std::allocator<glcts::TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::_run>_>_>
    ::operator++(&local_58,0);
  } while( true );
}

Assistant:

tcu::TestNode::IterateResult TessellationShaderTessellationgl_InvocationID_PatchVerticesIn_PrimitiveID::iterate(void)
{
	/* Do not execute if required extensions are not supported. */
	if (!m_is_tessellation_shader_supported)
	{
		throw tcu::NotSupportedError(TESSELLATION_SHADER_EXTENSION_NOT_SUPPORTED);
	}

	/* Initialize ES test objects */
	initTest();

	/* Initialize tessellation shader utilities */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* We don't need rasterization for this test */
	gl.enable(GL_RASTERIZER_DISCARD);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_RASTERIZER_DISCARD) failed.");

	/* Enable GL_PRIMITIVE_RESTART_FIXED_INDEX mode for indiced draw calls. */
	gl.enable(GL_PRIMITIVE_RESTART_FIXED_INDEX);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnable(GL_PRIMITIVE_RESTART_FIXED_INDEX) failed.");

	/* Iterate through all test runs configured */
	for (_runs_const_iterator run_iterator = m_runs.begin(); run_iterator != m_runs.end(); run_iterator++)
	{
		const _run& run = *run_iterator;

		/* Configure run-specific amount of vertices per patch */
		gl.patchParameteri(m_glExtTokens.PATCH_VERTICES, run.n_patch_vertices);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glPatchParameteriEXT() failed for GL_PATCH_VERTICES_EXT pname");

		/* Activate run-specific program object */
		gl.useProgram(run.po_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUseProgram() failed");

		/* Update GL_ELEMENT_ARRAY_BUFFER binding, depending on run properties */
		gl.bindBuffer(GL_ELEMENT_ARRAY_BUFFER, (run.drawcall_is_indiced) ? run.bo_indices_id : 0);
		GLU_EXPECT_NO_ERROR(gl.getError(), "Could not update GL_ELEMENT_ARRAY_BUFFER binding");

		/* Update transform feedback buffer bindings */
		gl.bindBuffer(GL_TRANSFORM_FEEDBACK_BUFFER, m_bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer() failed");

		gl.bindBufferBase(GL_TRANSFORM_FEEDBACK_BUFFER, 0 /* index */, m_bo_id);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBufferBase() failed");

		/* Update the transform feedback buffer object storage. For each generated
		 * tessellated coordinate, TE stage will output 5 integers. */
		glw::GLint bo_size = static_cast<glw::GLint>(run.n_result_vertices * 5 /* ints */ * sizeof(int));

		gl.bufferData(GL_TRANSFORM_FEEDBACK_BUFFER, bo_size, DE_NULL, GL_STATIC_DRAW);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData() failed");

		/* Render the geometry */
		glw::GLint  drawcall_count = run.n_patch_vertices * run.drawcall_count_multiplier + run.n_restart_indices;
		glw::GLenum tf_mode =
			TessellationShaderUtils::getTFModeForPrimitiveMode(run.primitive_mode, false); /* is_point_mode_enabled */

		gl.beginTransformFeedback(tf_mode);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glBeginTransformFeedback() failed");
		{
			if (run.drawcall_is_indiced)
			{
				if (run.n_instances != 1)
				{
					gl.drawElementsInstanced(m_glExtTokens.PATCHES, drawcall_count, GL_UNSIGNED_BYTE,
											 DE_NULL, /* indices */
											 run.n_instances);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElementsInstanced() failed");
				} /* if (run.n_instances != 0) */
				else
				{
					gl.drawElements(m_glExtTokens.PATCHES, drawcall_count, GL_UNSIGNED_BYTE, DE_NULL); /* indices */
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawElements() failed");
				}
			} /* if (run.drawcall_is_indiced) */
			else
			{
				if (run.n_instances != 1)
				{
					gl.drawArraysInstanced(m_glExtTokens.PATCHES, 0, /* first */
										   drawcall_count, run.n_instances);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArraysInstanced() failed");
				}
				else
				{
					gl.drawArrays(m_glExtTokens.PATCHES, 0, /* first */
								  drawcall_count);
					GLU_EXPECT_NO_ERROR(gl.getError(), "glDrawArrays() failed");
				}
			}
		}
		gl.endTransformFeedback();
		GLU_EXPECT_NO_ERROR(gl.getError(), "glEndTransformFeedback() failed");

		/* Map the result buffer object */
		const int* result_data = (const int*)gl.mapBufferRange(GL_TRANSFORM_FEEDBACK_BUFFER, 0, /* offset */
															   bo_size, GL_MAP_READ_BIT);

		GLU_EXPECT_NO_ERROR(gl.getError(), "glMapBufferRange() failed");

		/* Verify gl_InvocationID values used in both stages were correct. In TE:
		 *
		 * te_tc_invocation_id = in_tc[gl_PatchVerticesIn-1].tc_invocation_id;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_invocation_id is the very first item, so no need to offset
		 * result_data when initializing result_traveller_ptr below.
		 */
		const unsigned int n_int_varyings_per_tess_coordinate = 5;
		const int*		   result_traveller_ptr				  = result_data;

		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices;
			 ++n_coordinate, result_traveller_ptr += n_int_varyings_per_tess_coordinate)
		{
			const int expected_invocation_id = run.n_patch_vertices - 1;
			const int invocation_id_value	= *result_traveller_ptr;

			if (invocation_id_value != expected_invocation_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_InvocationID value (" << invocation_id_value
								   << ") "
									  "was found for result coordinate at index "
								   << n_coordinate << " "
													  "instead of expected value ("
								   << expected_invocation_id << ")." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_InvocationID value used in TC stage");
			}
		} /* for (all result coordinates) */

		/* Verify gl_PrimitiveID values used in both stages were correct. In TE:
		 *
		 * te_tc_primitive_id = in_tc[gl_PatchVerticesIn-1].tc_primitive_id;
		 * te_primitive_id    = gl_PrimitiveID;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_primitive_id is passed as 3rd string and te_primitive_id is located on
		 * 5th location.
		 */
		const unsigned int n_result_vertices_per_patch_vertex_batch =
			run.n_result_vertices / run.drawcall_count_multiplier / run.n_instances;
		const unsigned int n_result_vertices_per_instance = run.n_result_vertices / run.n_instances;

		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices; ++n_coordinate)
		{
			unsigned int actual_n_coordinate = n_coordinate;

			/* Subsequent instances reset gl_PrimitiveID counter */
			while (actual_n_coordinate >= n_result_vertices_per_instance)
			{
				actual_n_coordinate -= n_result_vertices_per_instance;
			}

			/* Calculate expected gl_PrimitiveID value */
			const int expected_primitive_id = actual_n_coordinate / n_result_vertices_per_patch_vertex_batch;

			/* te_tc_primitive_id */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 2; /* as per comment */

			if (*result_traveller_ptr != expected_primitive_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PrimitiveID value (" << *result_traveller_ptr
								   << ") "
									  "was used in TC stage instead of expected value ("
								   << expected_primitive_id << ") "
															   " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PrimitiveID value used in TC stage");
			}

			/* te_primitive_id */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 4; /* as per comment */

			if (*result_traveller_ptr != expected_primitive_id)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PrimitiveID value (" << *result_traveller_ptr
								   << ") "
									  "was used in TE stage instead of expected value ("
								   << expected_primitive_id << ") "
															   " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PrimitiveID value used in TE stage");
			}
		} /* for (all result coordinates) */

		/* Verify gl_PatchVerticesIn values used in both stages were correct. In TE:
		 *
		 * te_tc_patch_vertices_in = in_tc[gl_PatchVerticesIn-1].tc_patch_vertices_in;
		 * te_patch_vertices_in    = gl_PatchVerticesIn;
		 *
		 * In the list of varyings passed to glTransformFeedbackVaryings(),
		 * te_tc_patch_vertices_in takes 2nd location and te_patch_vertices_in is
		 * located at 4th position.
		 *
		 **/
		for (unsigned int n_coordinate = 0; n_coordinate < run.n_result_vertices; ++n_coordinate)
		{
			const int expected_patch_vertices_in_value = run.n_patch_vertices;

			/* te_tc_patch_vertices_in */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 1; /* as per comment */

			if (*result_traveller_ptr != expected_patch_vertices_in_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn value ("
								   << *result_traveller_ptr << ") "
															   "was used in TC stage instead of expected value ("
								   << expected_patch_vertices_in_value << ") "
																		  " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;

				TCU_FAIL("Invalid gl_PatchVerticesIn value used in TC stage");
			}

			/* te_patch_vertices_in */
			result_traveller_ptr =
				result_data + n_coordinate * n_int_varyings_per_tess_coordinate + 3; /* as per comment */

			if (*result_traveller_ptr != expected_patch_vertices_in_value)
			{
				m_testCtx.getLog() << tcu::TestLog::Message << "Invalid gl_PatchVerticesIn value ("
								   << *result_traveller_ptr << ") "
															   "was used in TE stage instead of expected value ("
								   << expected_patch_vertices_in_value << ") "
																		  " as stored for result coordinate at index "
								   << n_coordinate << "." << tcu::TestLog::EndMessage;
			}
		} /* for (all result coordinates) */

		/* Unmap the buffer object - we're done with this iteration */
		gl.unmapBuffer(GL_TRANSFORM_FEEDBACK_BUFFER);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glUnmapBuffer() failed");
	} /* for (all runs) */

	/* All done */
	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}